

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::BatchnormLayerParams::MergePartialFromCodedStream
          (BatchnormLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  float *pfVar4;
  uint8 *puVar5;
  bool bVar6;
  int length;
  int byte_limit;
  uint32 uVar7;
  undefined8 in_RAX;
  WeightParams *this_00;
  unsigned_long uVar8;
  pair<int,_int> pVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  pair<unsigned_long,_bool> pVar14;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_0020e37a:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar11 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar7 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
      goto LAB_0020e64a;
      uVar12 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_0020e64a:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar12 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar7 | uVar12;
  }
  uVar7 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto switchD_0020e417_caseD_2;
  cVar10 = (char)uVar12;
  switch((uint)(uVar12 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar10 != '\b') break;
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (-1 < (long)(char)*puVar5)) {
      this->channels_ = (long)(char)*puVar5;
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->channels_ = pVar14.first;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    goto LAB_0020e37a;
  case 5:
    if (cVar10 == '(') {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar5, -1 < (long)uVar8))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->computemeanvar_ = uVar8 != 0;
      goto LAB_0020e37a;
    }
    break;
  case 6:
    if (cVar10 == '0') {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar5, -1 < (long)uVar8))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->instancenormalization_ = uVar8 != 0;
      goto LAB_0020e37a;
    }
    break;
  case 10:
    if (cVar10 == 'U') {
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)((long)&uStack_38 + 4));
        if (!bVar6) {
          return false;
        }
        fVar13 = uStack_38._4_4_;
      }
      else {
        fVar13 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->epsilon_ = fVar13;
      goto LAB_0020e37a;
    }
    break;
  case 0xf:
    if (cVar10 != 'z') break;
    this_00 = this->gamma_;
    if (this_00 == (WeightParams *)0x0) {
      this_00 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(this_00);
      this->gamma_ = this_00;
    }
LAB_0020e59e:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (byte_limit = (int)(char)*puVar5, -1 < byte_limit)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar9 < 0) {
      return false;
    }
    bVar6 = WeightParams::MergePartialFromCodedStream(this_00,input);
    if (!bVar6) {
      return false;
    }
    bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar9.first);
    goto LAB_0020e3f7;
  case 0x10:
    if (cVar10 == -0x7e) {
      this_00 = this->beta_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->beta_ = this_00;
      }
      goto LAB_0020e59e;
    }
    break;
  case 0x11:
    if (cVar10 == -0x76) {
      this_00 = this->mean_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->mean_ = this_00;
      }
      goto LAB_0020e59e;
    }
    break;
  case 0x12:
    if (cVar10 == -0x6e) {
      this_00 = this->variance_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->variance_ = this_00;
      }
      goto LAB_0020e59e;
    }
  }
switchD_0020e417_caseD_2:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_0020e3f7:
  if (bVar6 == false) {
    return false;
  }
  goto LAB_0020e37a;
}

Assistant:

bool BatchnormLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BatchnormLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 channels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool computeMeanVar = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &computemeanvar_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool instanceNormalization = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &instancenormalization_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float epsilon = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(85u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &epsilon_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams gamma = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gamma()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams beta = 16;
      case 16: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(130u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams mean = 17;
      case 17: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(138u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mean()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams variance = 18;
      case 18: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(146u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_variance()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BatchnormLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BatchnormLayerParams)
  return false;
#undef DO_
}